

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

matches * atomopl(disctx *ctx,ull *a,ull *m,void *v,int spos)

{
  matches *pmVar1;
  
  if (ctx->reverse == 0) {
    ctx->oplen = *v;
    pmVar1 = (matches *)0x0;
  }
  else {
    pmVar1 = alwaysmatches(spos);
    pmVar1->m->oplen = *v;
  }
  return pmVar1;
}

Assistant:

struct matches *atomopl APROTO {
	if (!ctx->reverse) {
		ctx->oplen = *(int*)v;
		return NULL;
	} else {
		struct matches *res = alwaysmatches(spos);
		res->m[0].oplen = *(int*)v;
		return res;
	}
}